

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompoundString.cpp
# Opt level: O0

void __thiscall
Js::CompoundString::CompoundString
          (CompoundString *this,CharCount stringLength,CharCount directCharLength,void *buffer,
          CharCount usedCharLength,bool reserveMoreSpace,JavascriptLibrary *library)

{
  code *pcVar1;
  bool bVar2;
  StaticType *type;
  undefined4 *puVar3;
  Recycler *recycler;
  Block *ptr;
  bool reserveMoreSpace_local;
  CharCount usedCharLength_local;
  void *buffer_local;
  CharCount directCharLength_local;
  CharCount stringLength_local;
  CompoundString *this_local;
  
  type = JavascriptLibrary::GetStringTypeStatic(library);
  LiteralString::LiteralString(&this->super_LiteralString,type);
  (this->super_LiteralString).super_JavascriptString.super_RecyclableObject.super_FinalizableObject.
  super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject = (_func_int **)&PTR_Finalize_01dfc9b0;
  BlockInfo::BlockInfo(&this->lastBlockInfo);
  this->directCharLength = directCharLength;
  this->ownsLastBlock = true;
  Memory::WriteBarrierPtr<Js::CompoundString::Block>::WriteBarrierPtr(&this->lastBlock);
  if ((directCharLength != 0xffffffff) && (stringLength < directCharLength)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/CompoundString.cpp"
                                ,0x1ec,
                                "(directCharLength == static_cast<CharCount>(-1) || directCharLength <= stringLength)"
                                ,
                                "directCharLength == static_cast<CharCount>(-1) || directCharLength <= stringLength"
                               );
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  if (buffer == (void *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/CompoundString.cpp"
                                ,0x1ed,"(buffer)","buffer");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  if (library == (JavascriptLibrary *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/CompoundString.cpp"
                                ,0x1ee,"(library)","library");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  JavascriptString::SetLength((JavascriptString *)this,stringLength);
  recycler = JavascriptLibrary::GetRecycler(library);
  ptr = BlockInfo::CopyBuffer(&this->lastBlockInfo,buffer,usedCharLength,reserveMoreSpace,recycler);
  Memory::WriteBarrierPtr<Js::CompoundString::Block>::operator=(&this->lastBlock,ptr);
  return;
}

Assistant:

CompoundString::CompoundString(
        const CharCount stringLength,
        const CharCount directCharLength,
        const void *const buffer,
        const CharCount usedCharLength,
        const bool reserveMoreSpace,
        JavascriptLibrary *const library)
        : LiteralString(library->GetStringTypeStatic()),
        directCharLength(directCharLength),
        ownsLastBlock(true)
    {
        Assert(directCharLength == static_cast<CharCount>(-1) || directCharLength <= stringLength);
        Assert(buffer);
        Assert(library);

        SetLength(stringLength);
        lastBlock = lastBlockInfo.CopyBuffer(buffer, usedCharLength, reserveMoreSpace, library->GetRecycler());
    }